

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sokol_gfx.h
# Opt level: O0

sg_pass sg_make_pass(sg_pass_desc *desc)

{
  sg_pass pass_id_00;
  _sg_pass_t *pass_00;
  _sg_pass_t *pass;
  sg_pass_desc desc_def;
  sg_pass_desc *desc_local;
  sg_pass pass_id;
  
  desc_def._72_8_ = desc;
  if (!_sg.valid) {
    __assert_fail("_sg.valid",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/sokol-src/sokol_gfx.h"
                  ,0x3f4e,"sg_pass sg_make_pass(const sg_pass_desc *)");
  }
  if (desc == (sg_pass_desc *)0x0) {
    __assert_fail("desc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/sokol-src/sokol_gfx.h"
                  ,0x3f4f,"sg_pass sg_make_pass(const sg_pass_desc *)");
  }
  _sg_pass_desc_defaults((sg_pass_desc *)&pass,desc);
  pass_id_00 = _sg_alloc_pass();
  if (pass_id_00.id == 0) {
    _sg_log("pass pool exhausted!");
  }
  else {
    pass_00 = _sg_pass_at(&_sg.pools,pass_id_00.id);
    if ((pass_00 == (_sg_pass_t *)0x0) || ((pass_00->slot).state != SG_RESOURCESTATE_ALLOC)) {
      __assert_fail("pass && (pass->slot.state == SG_RESOURCESTATE_ALLOC)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/sokol-src/sokol_gfx.h"
                    ,0x3f54,"sg_pass sg_make_pass(const sg_pass_desc *)");
    }
    _sg_init_pass(pass_00,(sg_pass_desc *)&pass);
    if (((pass_00->slot).state != SG_RESOURCESTATE_VALID) &&
       ((pass_00->slot).state != SG_RESOURCESTATE_FAILED)) {
      __assert_fail("(pass->slot.state == SG_RESOURCESTATE_VALID) || (pass->slot.state == SG_RESOURCESTATE_FAILED)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/sokol-src/sokol_gfx.h"
                    ,0x3f56,"sg_pass sg_make_pass(const sg_pass_desc *)");
    }
  }
  return (sg_pass)pass_id_00.id;
}

Assistant:

inline sg_pass sg_make_pass(const sg_pass_desc& desc) { return sg_make_pass(&desc); }